

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O0

void __thiscall txpackage_tests::package_cpfp_tests::test_method(package_cpfp_tests *this)

{
  long lVar1;
  initializer_list<transaction_identifier<true>_> __l;
  initializer_list<transaction_identifier<true>_> __l_00;
  base_blob<256U> *pbVar2;
  bool bVar3;
  Wtxid *pWVar4;
  pointer ppVar5;
  long in_FS_OFFSET;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_ffffffffffffd2f8;
  CKey *pCVar6;
  char *pcVar7;
  CTransaction *tx;
  WitnessV0KeyHash *in_stack_ffffffffffffd300;
  CMutableTransaction *pCVar8;
  ValidationState<TxValidationResult> *this_00;
  CTxMemPool *pCVar9;
  ValidationState<PackageValidationResult> *this_01;
  CTxMemPool *in_stack_ffffffffffffd308;
  uint uVar12;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *pvVar10;
  char *pcVar11;
  assertion_result *this_02;
  undefined4 in_stack_ffffffffffffd310;
  uint32_t in_stack_ffffffffffffd314;
  undefined4 in_stack_ffffffffffffd318;
  int in_stack_ffffffffffffd31c;
  CKey *in_stack_ffffffffffffd320;
  lazy_ostream *in_stack_ffffffffffffd328;
  const_string *in_stack_ffffffffffffd330;
  const_string *file;
  undefined4 in_stack_ffffffffffffd338;
  int in_stack_ffffffffffffd33c;
  TestChain100Setup *in_stack_ffffffffffffd340;
  undefined7 in_stack_ffffffffffffd348;
  undefined1 in_stack_ffffffffffffd34f;
  optional<CFeeRate> *in_stack_ffffffffffffd368;
  undefined7 in_stack_ffffffffffffd370;
  undefined1 in_stack_ffffffffffffd377;
  CTxMemPool *in_stack_ffffffffffffd378;
  Chainstate *in_stack_ffffffffffffd380;
  undefined7 in_stack_ffffffffffffd3b8;
  undefined1 in_stack_ffffffffffffd3bf;
  uint256 *in_stack_ffffffffffffd3c0;
  CTxMemPool *in_stack_ffffffffffffd3c8;
  CFeeRate *in_stack_ffffffffffffd3e8;
  undefined7 in_stack_ffffffffffffd3f0;
  undefined1 in_stack_ffffffffffffd3f7;
  CTxMemPool *in_stack_ffffffffffffd448;
  undefined8 in_stack_ffffffffffffd450;
  PackageMempoolAcceptResult *in_stack_ffffffffffffd458;
  Package *in_stack_ffffffffffffd460;
  undefined4 in_stack_ffffffffffffd48c;
  undefined1 uVar13;
  CKey *in_stack_ffffffffffffd490;
  undefined8 in_stack_ffffffffffffd498;
  undefined7 in_stack_ffffffffffffd4a0;
  undefined1 in_stack_ffffffffffffd4a7;
  TestChain100Setup *in_stack_ffffffffffffd4a8;
  undefined7 in_stack_ffffffffffffd630;
  undefined1 in_stack_ffffffffffffd637;
  lazy_ostream *in_stack_ffffffffffffd638;
  CAmount child_fee;
  CAmount child_value;
  CAmount parent_value;
  CAmount coinbase_value;
  package_cpfp_tests *this_local;
  CKey *local_2258;
  undefined1 local_2250 [16];
  undefined1 local_2240 [64];
  const_string local_2200 [2];
  lazy_ostream local_21e0 [2];
  assertion_result local_21c0 [2];
  ValidationState<PackageValidationResult> local_2188;
  ValidationState<PackageValidationResult> local_212c;
  const_string local_20d8 [2];
  lazy_ostream local_20b8 [2];
  assertion_result local_2090 [2];
  const_string local_2058;
  lazy_ostream local_2048 [2];
  assertion_result local_2028;
  undefined8 local_2000;
  const_string local_1ff0 [2];
  lazy_ostream local_1fd0 [2];
  assertion_result local_1fb0 [2];
  const_string local_1f78 [2];
  lazy_ostream local_1f58 [2];
  assertion_result local_1f38 [2];
  const_string local_1f00 [2];
  lazy_ostream local_1ee0 [2];
  assertion_result local_1ec0 [2];
  const_iterator it_child_2;
  const_iterator it_parent_2;
  undefined1 local_1e78 [16];
  undefined1 local_1e68 [64];
  ValidationState<PackageValidationResult> local_1e28;
  const_string local_1dd0;
  lazy_ostream local_1dc0 [2];
  assertion_result local_1da0 [2];
  unsigned_long local_1d68;
  undefined1 local_1d60 [16];
  undefined1 local_1d50 [64];
  CTransactionRef tx_child_poor;
  CMutableTransaction mtx_child_poor;
  CTransactionRef tx_parent_rich;
  CMutableTransaction mtx_parent_rich;
  CAmount high_parent_fee;
  Package package_rich_parent;
  unsigned_long local_1c20;
  undefined1 local_1c18 [16];
  undefined1 local_1c08 [64];
  const_string local_1bc8 [2];
  lazy_ostream local_1ba8 [2];
  assertion_result local_1b88 [2];
  const_string local_1b50 [2];
  lazy_ostream local_1b30 [2];
  assertion_result local_1b10 [2];
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  expected_wtxids_1;
  const_string local_1ab8 [2];
  lazy_ostream local_1a98 [2];
  assertion_result local_1a78 [2];
  const_string local_1a40 [2];
  lazy_ostream local_1a20 [2];
  assertion_result local_1a00 [2];
  const_string local_19c8 [2];
  lazy_ostream local_19a8 [2];
  assertion_result local_1988 [2];
  const_string local_1950 [2];
  lazy_ostream local_1930 [2];
  assertion_result local_1910 [2];
  const_string local_18d8 [2];
  lazy_ostream local_18b8 [2];
  assertion_result local_1898 [2];
  const_string local_1860 [2];
  lazy_ostream local_1840 [2];
  assertion_result local_1820 [2];
  const_iterator it_child_1;
  const_iterator it_parent_1;
  undefined1 local_17d8 [104];
  CFeeRate expected_feerate_1;
  const_string local_1768;
  lazy_ostream local_1758 [2];
  assertion_result local_1738 [2];
  size_type local_1700;
  unsigned_long local_16f8;
  undefined1 local_16f0 [16];
  undefined1 local_16e0 [64];
  undefined1 local_16a0 [16];
  undefined1 local_1690 [64];
  undefined1 local_1650 [120];
  lazy_ostream local_15d8 [2];
  uint64_t local_15b8;
  assertion_result local_15a8 [2];
  undefined1 local_1570 [120];
  lazy_ostream local_14f8 [2];
  assertion_result local_14d0 [2];
  undefined1 local_1498 [104];
  lazy_ostream local_1430 [2];
  assertion_result local_1410 [2];
  _Base_ptr local_13d8;
  undefined1 local_13d0 [16];
  undefined1 local_13c0 [64];
  const_string local_1380 [2];
  lazy_ostream local_1360 [2];
  CAmount local_1340;
  assertion_result local_1338 [2];
  const_string local_1300 [2];
  lazy_ostream local_12e0 [2];
  size_t local_12c0;
  assertion_result local_12b8 [2];
  CTransactionRef tx_child_cheap;
  CMutableTransaction mtx_child_cheap;
  const_string local_1218 [2];
  lazy_ostream local_11f8 [2];
  assertion_result local_11d8 [2];
  const_string local_11a0 [2];
  lazy_ostream local_1180 [2];
  CAmount local_1160;
  assertion_result local_1158 [2];
  CTransactionRef tx_parent_cheap;
  CMutableTransaction mtx_parent_cheap;
  CAmount parent_fee;
  Package package_still_too_low;
  unsigned_long local_1098;
  undefined1 local_1090 [16];
  undefined1 local_1080 [64];
  const_string local_1040 [2];
  lazy_ostream local_1020 [2];
  assertion_result local_1000 [2];
  const_string local_fc8 [2];
  lazy_ostream local_fa8 [2];
  assertion_result local_f88 [2];
  const_string local_f50 [2];
  lazy_ostream local_f30 [2];
  assertion_result local_f10 [2];
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  expected_wtxids;
  const_string local_eb8 [2];
  lazy_ostream local_e98 [2];
  assertion_result local_e78 [2];
  const_string local_e40 [2];
  lazy_ostream local_e20 [2];
  assertion_result local_e00 [2];
  undefined8 local_dc8;
  CFeeRate expected_feerate;
  const_string local_db8 [2];
  lazy_ostream local_d98 [2];
  assertion_result local_d78 [2];
  const_string local_d40 [2];
  lazy_ostream local_d20 [2];
  assertion_result local_d00 [2];
  const_string local_cc8 [2];
  lazy_ostream local_ca8 [2];
  assertion_result local_c88 [2];
  const_string local_c50 [2];
  lazy_ostream local_c30 [2];
  assertion_result local_c10 [2];
  const_iterator it_child;
  const_iterator it_parent;
  const_string local_bc8;
  lazy_ostream local_bb8 [2];
  assertion_result local_b98 [2];
  unsigned_long local_b60;
  undefined1 local_b58 [16];
  undefined1 local_b48 [64];
  package_cpfp_tests *local_b08;
  CTransactionRef *local_b00;
  unsigned_long local_af8;
  undefined1 local_af0 [16];
  undefined1 local_ae0 [64];
  const_string local_aa0 [2];
  lazy_ostream local_a80 [2];
  _Base_ptr local_a60;
  assertion_result local_a58 [2];
  undefined1 local_a1c [16];
  TxValidationResult local_a0c;
  undefined1 local_a08 [16];
  undefined1 local_9f8 [68];
  undefined1 local_9b4 [16];
  TxValidationResult local_9a4;
  undefined1 local_9a0 [16];
  undefined1 local_990 [64];
  ValidationState<TxValidationResult> local_950;
  const_string local_8f8;
  lazy_ostream local_8e8 [2];
  assertion_result local_8c8 [2];
  unsigned_long local_890;
  undefined1 local_888 [16];
  undefined1 local_878 [64];
  undefined8 local_838;
  CTransactionRef tx_child;
  CMutableTransaction mtx_child;
  CTransactionRef tx_parent;
  CMutableTransaction mtx_parent;
  Package package_cpfp;
  CKey grandchild_key;
  CKey child_key;
  size_t expected_pool_size;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock20;
  undefined1 local_658 [32];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_rich_parent;
  PackageMempoolAcceptResult submit_rich_parent;
  undefined1 local_598 [64];
  _Base_ptr local_558;
  size_t sStack_550;
  undefined1 local_548 [48];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_prioritised;
  PackageMempoolAcceptResult submit_prioritised_package;
  undefined1 local_478 [32];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_package_too_low;
  PackageMempoolAcceptResult submit_package_too_low;
  undefined1 local_3b8 [64];
  uchar local_378 [8];
  uchar auStack_370 [8];
  uchar local_368 [16];
  uchar local_358 [8];
  uchar auStack_350 [8];
  uchar local_348 [16];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_cpfp;
  PackageMempoolAcceptResult submit_cpfp;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_cpfp_deprio;
  PackageMempoolAcceptResult submit_cpfp_deprio;
  undefined1 local_1d8 [232];
  CScript child_spk;
  CScript parent_spk;
  
  local_1000[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x0;
  local_1000[0]._1_7_ = 0;
  local_2000 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TestChain100Setup::mineBlocks(in_stack_ffffffffffffd340,in_stack_ffffffffffffd33c);
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffd2f8,0);
  TestChain100Setup::MockMempoolMinFee
            ((TestChain100Setup *)CONCAT17(in_stack_ffffffffffffd3f7,in_stack_ffffffffffffd3f0),
             in_stack_ffffffffffffd3e8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd2f8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd330,
             (char *)in_stack_ffffffffffffd328,&in_stack_ffffffffffffd320->fCompressed,
             in_stack_ffffffffffffd31c,SUB41((uint)in_stack_ffffffffffffd318 >> 0x18,0));
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_ffffffffffffd2f8);
  expected_pool_size = CTxMemPool::size(in_stack_ffffffffffffd308);
  GenerateRandomKey(SUB81((ulong)in_stack_ffffffffffffd300 >> 0x38,0));
  CKey::GetPubKey(in_stack_ffffffffffffd320);
  WitnessV0KeyHash::WitnessV0KeyHash
            ((WitnessV0KeyHash *)CONCAT44(in_stack_ffffffffffffd314,in_stack_ffffffffffffd310),
             (CPubKey *)in_stack_ffffffffffffd308);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<WitnessV0KeyHash,void,void,WitnessV0KeyHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd308,in_stack_ffffffffffffd300);
  GetScriptForDestination(in_stack_ffffffffffffd2f8);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant(in_stack_ffffffffffffd2f8);
  GenerateRandomKey(SUB81((ulong)in_stack_ffffffffffffd300 >> 0x38,0));
  CKey::GetPubKey(in_stack_ffffffffffffd320);
  WitnessV0KeyHash::WitnessV0KeyHash
            ((WitnessV0KeyHash *)CONCAT44(in_stack_ffffffffffffd314,in_stack_ffffffffffffd310),
             (CPubKey *)in_stack_ffffffffffffd308);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<WitnessV0KeyHash,void,void,WitnessV0KeyHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd308,in_stack_ffffffffffffd300);
  GetScriptForDestination(in_stack_ffffffffffffd2f8);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant(in_stack_ffffffffffffd2f8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_ffffffffffffd2f8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffd308,(size_type)in_stack_ffffffffffffd300);
  uVar12 = (uint)((ulong)in_stack_ffffffffffffd308 >> 0x20);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffd2f8,
             (shared_ptr<const_CTransaction> *)0xb77fae);
  CKey::CKey((CKey *)in_stack_ffffffffffffd328,in_stack_ffffffffffffd320);
  CScript::CScript((CScript *)in_stack_ffffffffffffd2f8,(CScript *)0xb77fe1);
  pCVar8 = (CMutableTransaction *)&DAT_12a05f138;
  pCVar6 = (CKey *)(local_1d8 + 0x20);
  pvVar10 = (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)((ulong)uVar12 << 0x20);
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffd4a8,
             (CTransactionRef *)CONCAT17(in_stack_ffffffffffffd4a7,in_stack_ffffffffffffd4a0),
             (uint32_t)((ulong)in_stack_ffffffffffffd498 >> 0x20),(int)in_stack_ffffffffffffd498,
             in_stack_ffffffffffffd490,
             (CScript *)CONCAT17(in_stack_ffffffffffffd637,in_stack_ffffffffffffd630),
             (CAmount)in_stack_ffffffffffffd638,SUB41((uint)in_stack_ffffffffffffd48c >> 0x18,0));
  CScript::~CScript((CScript *)pCVar6);
  CKey::~CKey(pCVar6);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pCVar6);
  MakeTransactionRef<CMutableTransaction&>(pCVar8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(pvVar10,(value_type *)pCVar8);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pCVar6,(shared_ptr<const_CTransaction> *)0xb7809d);
  CKey::CKey((CKey *)in_stack_ffffffffffffd328,in_stack_ffffffffffffd320);
  CScript::CScript((CScript *)pCVar6,(CScript *)0xb780c9);
  this_00 = (ValidationState<TxValidationResult> *)&DAT_124101038;
  pcVar7 = local_1d8;
  pcVar11 = (char *)((ulong)pvVar10 & 0xffffffff00000000);
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffd4a8,
             (CTransactionRef *)CONCAT17(in_stack_ffffffffffffd4a7,in_stack_ffffffffffffd4a0),
             (uint32_t)((ulong)in_stack_ffffffffffffd498 >> 0x20),(int)in_stack_ffffffffffffd498,
             in_stack_ffffffffffffd490,
             (CScript *)CONCAT17(in_stack_ffffffffffffd637,in_stack_ffffffffffffd630),
             (CAmount)in_stack_ffffffffffffd638,SUB41((uint)in_stack_ffffffffffffd48c >> 0x18,0));
  CScript::~CScript((CScript *)pcVar7);
  CKey::~CKey((CKey *)pcVar7);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar7);
  MakeTransactionRef<CMutableTransaction&>((CMutableTransaction *)this_00);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)pcVar11,(value_type *)this_00);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar7);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             pcVar7);
  CTransaction::GetHash((CTransaction *)pcVar7);
  transaction_identifier::operator_cast_to_uint256_((transaction_identifier<false> *)pcVar7);
  local_838 = 0xfffffffffa0a1e38;
  CTxMemPool::PrioritiseTransaction
            (in_stack_ffffffffffffd3c8,in_stack_ffffffffffffd3c0,
             (CAmount *)CONCAT17(in_stack_ffffffffffffd3bf,in_stack_ffffffffffffd3b8));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar7);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
               in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
               (const_string *)in_stack_ffffffffffffd320);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_00,(char (*) [1])pcVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar7);
    local_890 = CTxMemPool::size((CTxMemPool *)pcVar11);
    pcVar11 = "expected_pool_size";
    this_00 = (ValidationState<TxValidationResult> *)&expected_pool_size;
    pcVar7 = "m_node.mempool->size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_878,local_888,0x2ff,1,2,&local_890);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar7);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar7);
  ChainstateManager::ActiveChainstate((ChainstateManager *)pcVar11);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar11);
  std::optional<CFeeRate>::optional((optional<CFeeRate> *)pcVar7);
  ProcessNewPackage(in_stack_ffffffffffffd380,in_stack_ffffffffffffd378,
                    (Package *)CONCAT17(in_stack_ffffffffffffd377,in_stack_ffffffffffffd370),
                    (bool)in_stack_ffffffffffffd3f7,in_stack_ffffffffffffd368);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::get
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar7);
  CheckPackageMempoolAcceptResult_abi_cxx11_
            (in_stack_ffffffffffffd460,in_stack_ffffffffffffd458,
             SUB81((ulong)in_stack_ffffffffffffd450 >> 0x38,0),in_stack_ffffffffffffd448);
  bVar3 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)pcVar7);
  if (bVar3) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)this_00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar11);
      boost::unit_test::operator<<
                ((lazy_ostream *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_8c8,local_8e8,&local_8f8,0x303,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
  }
  else {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<((lazy_ostream *)this_00,(char (*) [1])pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      local_950.m_result =
           ValidationState<PackageValidationResult>::GetResult
                     ((ValidationState<PackageValidationResult> *)pcVar7);
      local_950.m_mode = M_ERROR;
      pcVar11 = "PackageValidationResult::PCKG_TX";
      this_00 = &local_950;
      pcVar7 = "submit_cpfp_deprio.m_state.GetResult()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
                (&local_950.m_reject_reason.field_2,&local_950.m_reject_reason,0x305,1,2,
                 &local_950.m_result);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<((lazy_ostream *)this_00,(char (*) [1])pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)pcVar7);
      CTransaction::GetWitnessHash((CTransaction *)pcVar7);
      transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar7);
      local_9b4._4_8_ =
           std::
           map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
           ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                   *)this_00,(key_type *)pcVar7);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      local_9a4 = ValidationState<TxValidationResult>::GetResult
                            ((ValidationState<TxValidationResult> *)pcVar7);
      local_9b4._0_4_ = 10;
      pcVar11 = "TxValidationResult::TX_MEMPOOL_POLICY";
      this_00 = (ValidationState<TxValidationResult> *)local_9b4;
      pcVar7 = 
      "submit_cpfp_deprio.m_tx_results.find(tx_parent->GetWitnessHash())->second.m_state.GetResult()"
      ;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxValidationResult,TxValidationResult>
                (local_990,local_9a0,0x307,1,2,&local_9a4);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<((lazy_ostream *)this_00,(char (*) [1])pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)pcVar7);
      CTransaction::GetWitnessHash((CTransaction *)pcVar7);
      transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar7);
      local_a1c._4_8_ =
           std::
           map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
           ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                   *)this_00,(key_type *)pcVar7);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      local_a0c = ValidationState<TxValidationResult>::GetResult
                            ((ValidationState<TxValidationResult> *)pcVar7);
      local_a1c._0_4_ = 5;
      pcVar11 = "TxValidationResult::TX_MISSING_INPUTS";
      this_00 = (ValidationState<TxValidationResult> *)local_a1c;
      pcVar7 = 
      "submit_cpfp_deprio.m_tx_results.find(tx_child->GetWitnessHash())->second.m_state.GetResult()"
      ;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxValidationResult,TxValidationResult>
                (local_9f8,local_a08,0x309,1,2,&local_a0c);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)pcVar7);
      CTransaction::GetWitnessHash((CTransaction *)pcVar7);
      transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar7);
      local_a60 = (_Base_ptr)
                  std::
                  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                  ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                          *)this_00,(key_type *)pcVar7);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      ValidationState<TxValidationResult>::GetRejectReason_abi_cxx11_(this_00);
      std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar11,
                      (char *)this_00);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)this_00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)this_00,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_a58,local_a80,local_aa0,0x30a,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<((lazy_ostream *)this_00,(char (*) [1])pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
                ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar7);
      local_af8 = CTxMemPool::size((CTxMemPool *)pcVar11);
      pcVar11 = "expected_pool_size";
      this_00 = (ValidationState<TxValidationResult> *)&expected_pool_size;
      pcVar7 = "m_node.mempool->size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                (local_ae0,local_af0,0x30b,1,2,&local_af8);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar7);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult((PackageMempoolAcceptResult *)pcVar7);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar7);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)pcVar7);
  local_b00 = &tx_parent;
  local_b08 = this;
  test_method::anon_class_16_2_ac15ef32::operator()
            ((anon_class_16_2_ac15ef32 *)in_stack_ffffffffffffd328);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar7);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
               in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
               (const_string *)in_stack_ffffffffffffd320);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_00,(char (*) [1])pcVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar7);
    local_b60 = CTxMemPool::size((CTxMemPool *)pcVar11);
    pcVar11 = "expected_pool_size";
    this_00 = (ValidationState<TxValidationResult> *)&expected_pool_size;
    pcVar7 = "m_node.mempool->size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_b48,local_b58,0x315,1,2,&local_b60);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar7);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar7);
  ChainstateManager::ActiveChainstate((ChainstateManager *)pcVar11);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar11);
  std::optional<CFeeRate>::optional((optional<CFeeRate> *)pcVar7);
  ProcessNewPackage(in_stack_ffffffffffffd380,in_stack_ffffffffffffd378,
                    (Package *)CONCAT17(in_stack_ffffffffffffd377,in_stack_ffffffffffffd370),
                    (bool)in_stack_ffffffffffffd3f7,in_stack_ffffffffffffd368);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::get
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar7);
  CheckPackageMempoolAcceptResult_abi_cxx11_
            (in_stack_ffffffffffffd460,in_stack_ffffffffffffd458,
             SUB81((ulong)in_stack_ffffffffffffd450 >> 0x38,0),in_stack_ffffffffffffd448);
  bVar3 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)pcVar7);
  if (bVar3) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)this_00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar11);
      boost::unit_test::operator<<
                ((lazy_ostream *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_b98,local_bb8,&local_bc8,0x319,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
  }
  else {
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar7);
    CTransaction::GetWitnessHash((CTransaction *)pcVar7);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar7);
    std::
    map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            *)this_00,(key_type *)pcVar7);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar7);
    CTransaction::GetWitnessHash((CTransaction *)pcVar7);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar7);
    it_child = std::
               map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
               ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                       *)this_00,(key_type *)pcVar7);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)this_00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)this_00,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_c10,local_c30,local_c50,0x31d,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      std::optional<long>::value((optional<long> *)pcVar11);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)this_00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)this_00,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_c88,local_ca8,local_cc8,0x31e,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)this_00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)this_00,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_d00,local_d20,local_d40,799,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      std::optional<long>::value((optional<long> *)pcVar11);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)this_00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)this_00,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_d78,local_d98,local_db8,800,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    local_dc8 = 0x5f5e1c8;
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              pcVar11);
    GetVirtualTransactionSize((CTransaction *)pcVar7);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              pcVar11);
    GetVirtualTransactionSize((CTransaction *)pcVar7);
    CFeeRate::CFeeRate((CFeeRate *)CONCAT44(in_stack_ffffffffffffd31c,in_stack_ffffffffffffd318),
                       (CAmount *)CONCAT44(in_stack_ffffffffffffd314,in_stack_ffffffffffffd310),
                       (uint32_t)((ulong)pcVar11 >> 0x20));
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      std::optional<CFeeRate>::value((optional<CFeeRate> *)pcVar11);
      ::operator==((CFeeRate *)pcVar11,(CFeeRate *)this_00);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)this_00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)this_00,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_e00,local_e20,local_e40,0x324,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      std::optional<CFeeRate>::value((optional<CFeeRate> *)pcVar11);
      ::operator==((CFeeRate *)pcVar11,(CFeeRate *)this_00);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)this_00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)this_00,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_e78,local_e98,local_eb8,0x325,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar7);
    pWVar4 = CTransaction::GetWitnessHash((CTransaction *)pcVar7);
    local_378 = *(uchar (*) [8])(pWVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems;
    auStack_370 = *(uchar (*) [8])((pWVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
    local_368._0_8_ =
         *(undefined8 *)((pWVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
    pbVar2 = &(pWVar4->m_wrapped).super_base_blob<256U>;
    local_368[8] = (pbVar2->m_data)._M_elems[0x18];
    local_368[9] = (pbVar2->m_data)._M_elems[0x19];
    local_368[10] = (pbVar2->m_data)._M_elems[0x1a];
    local_368[0xb] = (pbVar2->m_data)._M_elems[0x1b];
    local_368[0xc] = (pbVar2->m_data)._M_elems[0x1c];
    local_368[0xd] = (pbVar2->m_data)._M_elems[0x1d];
    local_368[0xe] = (pbVar2->m_data)._M_elems[0x1e];
    local_368[0xf] = (pbVar2->m_data)._M_elems[0x1f];
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar7);
    pWVar4 = CTransaction::GetWitnessHash((CTransaction *)pcVar7);
    local_358 = *(uchar (*) [8])(pWVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems;
    auStack_350 = *(uchar (*) [8])((pWVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
    local_348._0_8_ =
         *(undefined8 *)((pWVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
    pbVar2 = &(pWVar4->m_wrapped).super_base_blob<256U>;
    local_348[8] = (pbVar2->m_data)._M_elems[0x18];
    local_348[9] = (pbVar2->m_data)._M_elems[0x19];
    local_348[10] = (pbVar2->m_data)._M_elems[0x1a];
    local_348[0xb] = (pbVar2->m_data)._M_elems[0x1b];
    local_348[0xc] = (pbVar2->m_data)._M_elems[0x1c];
    local_348[0xd] = (pbVar2->m_data)._M_elems[0x1d];
    local_348[0xe] = (pbVar2->m_data)._M_elems[0x1e];
    local_348[0xf] = (pbVar2->m_data)._M_elems[0x1f];
    std::allocator<transaction_identifier<true>_>::allocator
              ((allocator<transaction_identifier<true>_> *)pcVar7);
    __l._M_len._0_7_ = in_stack_ffffffffffffd348;
    __l._M_array = (iterator)in_stack_ffffffffffffd340;
    __l._M_len._7_1_ = in_stack_ffffffffffffd34f;
    std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
    vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *)
           CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),__l,
           (allocator_type *)in_stack_ffffffffffffd330);
    std::allocator<transaction_identifier<true>_>::~allocator
              ((allocator<transaction_identifier<true>_> *)pcVar7);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      std::
      optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
      ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
               *)pcVar11);
      std::operator==((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                       *)in_stack_ffffffffffffd328,
                      (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                       *)in_stack_ffffffffffffd320);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)this_00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)this_00,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_f10,local_f30,local_f50,0x327,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      std::
      optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
      ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
               *)pcVar11);
      std::operator==((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                       *)in_stack_ffffffffffffd328,
                      (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                       *)in_stack_ffffffffffffd320);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)this_00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)this_00,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_f88,local_fa8,local_fc8,0x328,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      CFeeRate::GetFeePerK((CFeeRate *)pcVar7);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)this_00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)this_00,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1000,local_1020,local_1040,0x329,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
    ~vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *)
            pcVar11);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar7);
  expected_pool_size = expected_pool_size + 2;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar7);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
               in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
               (const_string *)in_stack_ffffffffffffd320);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_00,(char (*) [1])pcVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)this_00,(unsigned_long)pcVar7);
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar7);
    local_1098 = CTxMemPool::size((CTxMemPool *)pcVar11);
    pcVar11 = "expected_pool_size";
    this_00 = (ValidationState<TxValidationResult> *)&expected_pool_size;
    pcVar7 = "m_node.mempool->size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_1080,local_1090,0x32c,1,2,&local_1098);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar7);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult((PackageMempoolAcceptResult *)pcVar7);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)pcVar7);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)pcVar11,(size_type)this_00);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pcVar7,(shared_ptr<const_CTransaction> *)0xb7ab42);
  CKey::CKey((CKey *)in_stack_ffffffffffffd328,in_stack_ffffffffffffd320);
  CScript::CScript((CScript *)pcVar7,(CScript *)0xb7ab75);
  pCVar9 = (CTxMemPool *)&DAT_12a05f138;
  tx = (CTransaction *)(local_3b8 + 0x20);
  this_02 = (assertion_result *)((ulong)pcVar11 & 0xffffffff00000000);
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffd4a8,
             (CTransactionRef *)CONCAT17(in_stack_ffffffffffffd4a7,in_stack_ffffffffffffd4a0),
             (uint32_t)((ulong)in_stack_ffffffffffffd498 >> 0x20),(int)in_stack_ffffffffffffd498,
             in_stack_ffffffffffffd490,
             (CScript *)CONCAT17(in_stack_ffffffffffffd637,in_stack_ffffffffffffd630),
             (CAmount)in_stack_ffffffffffffd638,SUB41((uint)in_stack_ffffffffffffd48c >> 0x18,0));
  CScript::~CScript((CScript *)tx);
  CKey::~CKey((CKey *)tx);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)tx);
  MakeTransactionRef<CMutableTransaction&>((CMutableTransaction *)pCVar9);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_02,(value_type *)pCVar9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,(pointer)pCVar9,(unsigned_long)tx);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)tx);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
               in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
               (const_string *)in_stack_ffffffffffffd320);
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)tx);
    local_1160 = (CAmount)CTxMemPool::GetMinFee(pCVar9);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              this_02);
    GetVirtualTransactionSize(tx);
    CFeeRate::GetFee((CFeeRate *)CONCAT44(in_stack_ffffffffffffd31c,in_stack_ffffffffffffd318),
                     in_stack_ffffffffffffd314);
    boost::test_tools::assertion_result::assertion_result(this_02,SUB81((ulong)pCVar9 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,(pointer)pCVar9,(unsigned_long)tx);
    boost::unit_test::operator<<((lazy_ostream *)pCVar9,(basic_cstring<const_char> *)tx);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,(pointer)pCVar9,(unsigned_long)tx);
    tx = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1158,local_1180,local_11a0,0x33b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)tx);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)tx);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,(pointer)pCVar9,(unsigned_long)tx);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)tx);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
               in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
               (const_string *)in_stack_ffffffffffffd320);
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)tx);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              this_02);
    GetVirtualTransactionSize(tx);
    CFeeRate::GetFee((CFeeRate *)CONCAT44(in_stack_ffffffffffffd31c,in_stack_ffffffffffffd318),
                     in_stack_ffffffffffffd314);
    boost::test_tools::assertion_result::assertion_result(this_02,SUB81((ulong)pCVar9 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,(pointer)pCVar9,(unsigned_long)tx);
    boost::unit_test::operator<<((lazy_ostream *)pCVar9,(basic_cstring<const_char> *)tx);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,(pointer)pCVar9,(unsigned_long)tx);
    tx = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_11d8,local_11f8,local_1218,0x33c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)tx);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)tx);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)tx,(shared_ptr<const_CTransaction> *)0xb7afb5);
  CKey::CKey((CKey *)in_stack_ffffffffffffd328,in_stack_ffffffffffffd320);
  CScript::CScript((CScript *)tx,(CScript *)0xb7afe1);
  pCVar9 = (CTxMemPool *)&DAT_12a05eee0;
  pcVar7 = local_3b8;
  pcVar11 = (char *)((ulong)this_02 & 0xffffffff00000000);
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffd4a8,
             (CTransactionRef *)CONCAT17(in_stack_ffffffffffffd4a7,in_stack_ffffffffffffd4a0),
             (uint32_t)((ulong)in_stack_ffffffffffffd498 >> 0x20),(int)in_stack_ffffffffffffd498,
             in_stack_ffffffffffffd490,
             (CScript *)CONCAT17(in_stack_ffffffffffffd637,in_stack_ffffffffffffd630),
             (CAmount)in_stack_ffffffffffffd638,SUB41((uint)in_stack_ffffffffffffd48c >> 0x18,0));
  CScript::~CScript((CScript *)pcVar7);
  CKey::~CKey((CKey *)pcVar7);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar7);
  MakeTransactionRef<CMutableTransaction&>((CMutableTransaction *)pCVar9);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)pcVar11,(value_type *)pCVar9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar7);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
               in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
               (const_string *)in_stack_ffffffffffffd320);
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar7);
    local_12c0 = (size_t)CTxMemPool::GetMinFee(pCVar9);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              pcVar11);
    GetVirtualTransactionSize((CTransaction *)pcVar7);
    CFeeRate::GetFee((CFeeRate *)CONCAT44(in_stack_ffffffffffffd31c,in_stack_ffffffffffffd318),
                     in_stack_ffffffffffffd314);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pcVar11,SUB81((ulong)pCVar9 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
    boost::unit_test::operator<<((lazy_ostream *)pCVar9,(basic_cstring<const_char> *)pcVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
    pcVar7 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_12b8,local_12e0,local_1300,0x344,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar7);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar7);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
               in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
               (const_string *)in_stack_ffffffffffffd320);
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar7);
    local_1340 = (CAmount)CTxMemPool::GetMinFee(pCVar9);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              pcVar11);
    GetVirtualTransactionSize((CTransaction *)pcVar7);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              pcVar11);
    GetVirtualTransactionSize((CTransaction *)pcVar7);
    CFeeRate::GetFee((CFeeRate *)CONCAT44(in_stack_ffffffffffffd31c,in_stack_ffffffffffffd318),
                     in_stack_ffffffffffffd314);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pcVar11,SUB81((ulong)pCVar9 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
    boost::unit_test::operator<<((lazy_ostream *)pCVar9,(basic_cstring<const_char> *)pcVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
    pcVar7 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1338,local_1360,local_1380,0x345,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar7);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar7);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
               in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
               (const_string *)in_stack_ffffffffffffd320);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar9,(char (*) [1])pcVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar7);
    local_13d8 = (_Base_ptr)CTxMemPool::size((CTxMemPool *)pcVar11);
    pcVar11 = "expected_pool_size";
    pCVar9 = (CTxMemPool *)&expected_pool_size;
    pcVar7 = "m_node.mempool->size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_13c0,local_13d0,0x346,1,2,&local_13d8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar7);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar7);
  ChainstateManager::ActiveChainstate((ChainstateManager *)pcVar11);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar11);
  std::optional<CFeeRate>::optional((optional<CFeeRate> *)pcVar7);
  ProcessNewPackage(in_stack_ffffffffffffd380,in_stack_ffffffffffffd378,
                    (Package *)CONCAT17(in_stack_ffffffffffffd377,in_stack_ffffffffffffd370),
                    (bool)in_stack_ffffffffffffd3f7,in_stack_ffffffffffffd368);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::get
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar7);
  CheckPackageMempoolAcceptResult_abi_cxx11_
            (in_stack_ffffffffffffd460,in_stack_ffffffffffffd458,
             SUB81((ulong)in_stack_ffffffffffffd450 >> 0x38,0),in_stack_ffffffffffffd448);
  bVar3 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)pcVar7);
  if (bVar3) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)pCVar9 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar11);
      boost::unit_test::operator<<
                ((lazy_ostream *)pCVar9,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1410,local_1430,(const_string *)(local_1498 + 0x58),0x34d,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
  }
  else {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<((lazy_ostream *)pCVar9,(char (*) [1])pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)pcVar7);
      CTransaction::GetWitnessHash((CTransaction *)pcVar7);
      transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar7);
      std::
      map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
      ::at((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            *)in_stack_ffffffffffffd320,
           (key_type *)CONCAT44(in_stack_ffffffffffffd31c,in_stack_ffffffffffffd318));
      local_1498._4_4_ =
           ValidationState<TxValidationResult>::GetResult
                     ((ValidationState<TxValidationResult> *)pcVar7);
      local_1498._0_4_ = 0xc;
      pcVar11 = "TxValidationResult::TX_RECONSIDERABLE";
      pCVar9 = (CTxMemPool *)local_1498;
      pcVar7 = 
      "submit_package_too_low.m_tx_results.at(tx_parent_cheap->GetWitnessHash()).m_state.GetResult()"
      ;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxValidationResult,TxValidationResult>
                (local_1498 + 0x18,local_1498 + 8,0x351,1,2,local_1498 + 4);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)pcVar7);
      CTransaction::GetWitnessHash((CTransaction *)pcVar7);
      transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar7);
      std::
      map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
      ::at((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            *)in_stack_ffffffffffffd320,
           (key_type *)CONCAT44(in_stack_ffffffffffffd31c,in_stack_ffffffffffffd318));
      std::optional<CFeeRate>::value((optional<CFeeRate> *)pcVar11);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                )pcVar11);
      GetVirtualTransactionSize((CTransaction *)pcVar7);
      CFeeRate::CFeeRate((CFeeRate *)CONCAT44(in_stack_ffffffffffffd31c,in_stack_ffffffffffffd318),
                         (CAmount *)CONCAT44(in_stack_ffffffffffffd314,in_stack_ffffffffffffd310),
                         (uint32_t)((ulong)pcVar11 >> 0x20));
      ::operator==((CFeeRate *)pcVar11,(CFeeRate *)pCVar9);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)pCVar9 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)pCVar9,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_14d0,local_14f8,(const_string *)(local_1570 + 0x58),0x353,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<((lazy_ostream *)pCVar9,(char (*) [1])pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)pcVar7);
      CTransaction::GetWitnessHash((CTransaction *)pcVar7);
      transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar7);
      std::
      map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
      ::at((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            *)in_stack_ffffffffffffd320,
           (key_type *)CONCAT44(in_stack_ffffffffffffd31c,in_stack_ffffffffffffd318));
      local_1570._4_4_ =
           ValidationState<TxValidationResult>::GetResult
                     ((ValidationState<TxValidationResult> *)pcVar7);
      local_1570._0_4_ = 0xc;
      pcVar11 = "TxValidationResult::TX_RECONSIDERABLE";
      pCVar9 = (CTxMemPool *)local_1570;
      pcVar7 = 
      "submit_package_too_low.m_tx_results.at(tx_child_cheap->GetWitnessHash()).m_state.GetResult()"
      ;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxValidationResult,TxValidationResult>
                (local_1570 + 0x18,local_1570 + 8,0x356,1,2,local_1570 + 4);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)pcVar7);
      CTransaction::GetWitnessHash((CTransaction *)pcVar7);
      transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar7);
      std::
      map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
      ::at((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            *)in_stack_ffffffffffffd320,
           (key_type *)CONCAT44(in_stack_ffffffffffffd31c,in_stack_ffffffffffffd318));
      std::optional<CFeeRate>::value((optional<CFeeRate> *)pcVar11);
      local_15b8 = 800;
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                )pcVar11);
      GetVirtualTransactionSize((CTransaction *)pcVar7);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                )pcVar11);
      GetVirtualTransactionSize((CTransaction *)pcVar7);
      CFeeRate::CFeeRate((CFeeRate *)CONCAT44(in_stack_ffffffffffffd31c,in_stack_ffffffffffffd318),
                         (CAmount *)CONCAT44(in_stack_ffffffffffffd314,in_stack_ffffffffffffd310),
                         (uint32_t)((ulong)pcVar11 >> 0x20));
      ::operator==((CFeeRate *)pcVar11,(CFeeRate *)pCVar9);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)pCVar9 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)pCVar9,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_15a8,local_15d8,(const_string *)(local_1650 + 0x58),0x358,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar7);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
               in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
               (const_string *)in_stack_ffffffffffffd320);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar9,(char (*) [1])pcVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
    local_1650._4_4_ =
         ValidationState<PackageValidationResult>::GetResult
                   ((ValidationState<PackageValidationResult> *)pcVar7);
    local_1650._0_4_ = 2;
    pcVar11 = "PackageValidationResult::PCKG_TX";
    pCVar9 = (CTxMemPool *)local_1650;
    pcVar7 = "submit_package_too_low.m_state.GetResult()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
              (local_1650 + 0x18,local_1650 + 8,0x35a,1,2,local_1650 + 4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar7);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar7);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
               in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
               (const_string *)in_stack_ffffffffffffd320);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar9,(char (*) [1])pcVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
    ValidationState<PackageValidationResult>::GetRejectReason_abi_cxx11_
              ((ValidationState<PackageValidationResult> *)pCVar9);
    pcVar11 = "\"transaction failed\"";
    pCVar9 = (CTxMemPool *)0x1e69d78;
    pcVar7 = "submit_package_too_low.m_state.GetRejectReason()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[19]>
              (local_1690,local_16a0,0x35b,1,2,local_478);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar7);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar7);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar7);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
               in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
               (const_string *)in_stack_ffffffffffffd320);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar9,(char (*) [1])pcVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar7);
    local_16f8 = CTxMemPool::size((CTxMemPool *)pcVar11);
    pcVar11 = "expected_pool_size";
    pCVar9 = (CTxMemPool *)&expected_pool_size;
    pcVar7 = "m_node.mempool->size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_16e0,local_16f0,0x35c,1,2,&local_16f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar7);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult((PackageMempoolAcceptResult *)pcVar7);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar7);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             pcVar7);
  CTransaction::GetHash((CTransaction *)pcVar7);
  transaction_identifier::operator_cast_to_uint256_((transaction_identifier<false> *)pcVar7);
  local_1700 = 100000000;
  CTxMemPool::PrioritiseTransaction
            (in_stack_ffffffffffffd3c8,in_stack_ffffffffffffd3c0,
             (CAmount *)CONCAT17(in_stack_ffffffffffffd3bf,in_stack_ffffffffffffd3b8));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar7);
  ChainstateManager::ActiveChainstate((ChainstateManager *)pcVar11);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar11);
  std::optional<CFeeRate>::optional((optional<CFeeRate> *)pcVar7);
  ProcessNewPackage(in_stack_ffffffffffffd380,in_stack_ffffffffffffd378,
                    (Package *)CONCAT17(in_stack_ffffffffffffd377,in_stack_ffffffffffffd370),
                    (bool)in_stack_ffffffffffffd3f7,in_stack_ffffffffffffd368);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::get
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar7);
  CheckPackageMempoolAcceptResult_abi_cxx11_
            (in_stack_ffffffffffffd460,in_stack_ffffffffffffd458,
             SUB81((ulong)in_stack_ffffffffffffd450 >> 0x38,0),in_stack_ffffffffffffd448);
  bVar3 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)pcVar7);
  if (bVar3) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)pCVar9 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar11);
      boost::unit_test::operator<<
                ((lazy_ostream *)pCVar9,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1738,local_1758,&local_1768,0x367,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
  }
  else {
    local_17d8._96_8_ = 0x5f5e420;
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              pcVar11);
    GetVirtualTransactionSize((CTransaction *)pcVar7);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              pcVar11);
    GetVirtualTransactionSize((CTransaction *)pcVar7);
    CFeeRate::CFeeRate((CFeeRate *)CONCAT44(in_stack_ffffffffffffd31c,in_stack_ffffffffffffd318),
                       (CAmount *)CONCAT44(in_stack_ffffffffffffd314,in_stack_ffffffffffffd310),
                       (uint32_t)((ulong)pcVar11 >> 0x20));
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<((lazy_ostream *)pCVar9,(char (*) [1])pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      local_17d8._8_8_ =
           std::
           map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
           ::size((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                   *)pcVar7);
      local_17d8._0_8_ =
           std::
           vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   *)pcVar7);
      pcVar11 = "package_still_too_low.size()";
      pCVar9 = (CTxMemPool *)local_17d8;
      pcVar7 = "submit_prioritised_package.m_tx_results.size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                (local_17d8 + 0x20,local_17d8 + 0x10,0x36b,1,2,local_17d8 + 8);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar7);
    CTransaction::GetWitnessHash((CTransaction *)pcVar7);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar7);
    std::
    map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            *)pCVar9,(key_type *)pcVar7);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar7);
    CTransaction::GetWitnessHash((CTransaction *)pcVar7);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar7);
    it_child_1 = std::
                 map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                 ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                         *)pCVar9,(key_type *)pcVar7);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)pCVar9 >> 0x38,0));
      in_stack_ffffffffffffd638 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)pCVar9,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1820,local_1840,local_1860,0x36e,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      in_stack_ffffffffffffd637 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_ffffffffffffd637);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      std::optional<long>::value((optional<long> *)pcVar11);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)pCVar9 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)pCVar9,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1898,local_18b8,local_18d8,0x36f,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      std::optional<CFeeRate>::value((optional<CFeeRate> *)pcVar11);
      ::operator==((CFeeRate *)pcVar11,(CFeeRate *)pCVar9);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)pCVar9 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)pCVar9,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1910,local_1930,local_1950,0x370,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)pCVar9 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)pCVar9,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1988,local_19a8,local_19c8,0x371,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      std::optional<long>::value((optional<long> *)pcVar11);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)pCVar9 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)pCVar9,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1a00,local_1a20,local_1a40,0x372,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      std::optional<CFeeRate>::value((optional<CFeeRate> *)pcVar11);
      ::operator==((CFeeRate *)pcVar11,(CFeeRate *)pCVar9);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)pCVar9 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)pCVar9,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1a78,local_1a98,local_1ab8,0x373,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar7);
    pWVar4 = CTransaction::GetWitnessHash((CTransaction *)pcVar7);
    local_558 = *(_Base_ptr *)(pWVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems;
    sStack_550 = *(size_t *)((pWVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
    local_548._0_8_ =
         *(undefined8 *)((pWVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
    local_548._8_8_ =
         *(undefined8 *)((pWVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar7);
    pWVar4 = CTransaction::GetWitnessHash((CTransaction *)pcVar7);
    local_548._16_8_ = *(undefined8 *)(pWVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems;
    local_548._24_8_ =
         *(undefined8 *)((pWVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
    local_548._32_8_ =
         *(undefined8 *)((pWVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
    local_548._40_8_ =
         *(undefined8 *)((pWVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
    std::allocator<transaction_identifier<true>_>::allocator
              ((allocator<transaction_identifier<true>_> *)pcVar7);
    __l_00._M_len._0_7_ = in_stack_ffffffffffffd348;
    __l_00._M_array = (iterator)in_stack_ffffffffffffd340;
    __l_00._M_len._7_1_ = in_stack_ffffffffffffd34f;
    std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
    vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *)
           CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),__l_00,
           (allocator_type *)in_stack_ffffffffffffd330);
    std::allocator<transaction_identifier<true>_>::~allocator
              ((allocator<transaction_identifier<true>_> *)pcVar7);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      std::
      optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
      ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
               *)pcVar11);
      std::operator==((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                       *)in_stack_ffffffffffffd328,
                      (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                       *)in_stack_ffffffffffffd320);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)pCVar9 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)pCVar9,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1b10,local_1b30,local_1b50,0x375,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      std::
      optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
      ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
               *)pcVar11);
      std::operator==((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                       *)in_stack_ffffffffffffd328,
                      (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                       *)in_stack_ffffffffffffd320);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)pCVar9 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)pCVar9,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1b88,local_1ba8,local_1bc8,0x376,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
    ~vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *)
            pcVar11);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar7);
  expected_pool_size = expected_pool_size + 2;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar7);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
               in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
               (const_string *)in_stack_ffffffffffffd320);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar9,(char (*) [1])pcVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)pCVar9,(unsigned_long)pcVar7);
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar7);
    local_1c20 = CTxMemPool::size((CTxMemPool *)pcVar11);
    pcVar11 = "expected_pool_size";
    pCVar9 = (CTxMemPool *)&expected_pool_size;
    pcVar7 = "m_node.mempool->size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_1c08,local_1c18,0x379,1,2,&local_1c20);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar7);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
    uVar13 = (undefined1)((uint)in_stack_ffffffffffffd48c >> 0x18);
  } while (bVar3);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult((PackageMempoolAcceptResult *)pcVar7);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)pcVar7);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)pcVar11,(size_type)pCVar9);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pcVar7,(shared_ptr<const_CTransaction> *)0xb7e0e9);
  CKey::CKey((CKey *)in_stack_ffffffffffffd328,in_stack_ffffffffffffd320);
  CScript::CScript((CScript *)pcVar7,(CScript *)0xb7e11c);
  pCVar8 = (CMutableTransaction *)&DAT_124101100;
  pCVar6 = (CKey *)(local_598 + 0x20);
  pvVar10 = (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)((ulong)pcVar11 & 0xffffffff00000000);
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffd4a8,
             (CTransactionRef *)CONCAT17(in_stack_ffffffffffffd4a7,in_stack_ffffffffffffd4a0),
             (uint32_t)((ulong)in_stack_ffffffffffffd498 >> 0x20),(int)in_stack_ffffffffffffd498,
             in_stack_ffffffffffffd490,
             (CScript *)CONCAT17(in_stack_ffffffffffffd637,in_stack_ffffffffffffd630),
             (CAmount)in_stack_ffffffffffffd638,(bool)uVar13);
  CScript::~CScript((CScript *)pCVar6);
  CKey::~CKey(pCVar6);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pCVar6);
  MakeTransactionRef<CMutableTransaction&>(pCVar8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(pvVar10,(value_type *)pCVar8);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pCVar6,(shared_ptr<const_CTransaction> *)0xb7e1d8);
  CKey::CKey((CKey *)in_stack_ffffffffffffd328,in_stack_ffffffffffffd320);
  CScript::CScript((CScript *)pCVar6,(CScript *)0xb7e204);
  this_01 = (ValidationState<PackageValidationResult> *)&DAT_124101100;
  pcVar7 = local_598;
  pcVar11 = (char *)((ulong)pvVar10 & 0xffffffff00000000);
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffd4a8,
             (CTransactionRef *)CONCAT17(in_stack_ffffffffffffd4a7,in_stack_ffffffffffffd4a0),
             (uint32_t)((ulong)in_stack_ffffffffffffd498 >> 0x20),(int)in_stack_ffffffffffffd498,
             in_stack_ffffffffffffd490,
             (CScript *)CONCAT17(in_stack_ffffffffffffd637,in_stack_ffffffffffffd630),
             (CAmount)in_stack_ffffffffffffd638,(bool)uVar13);
  CScript::~CScript((CScript *)pcVar7);
  CKey::~CKey((CKey *)pcVar7);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar7);
  MakeTransactionRef<CMutableTransaction&>((CMutableTransaction *)this_01);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)pcVar11,(value_type *)this_01);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar7);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
               in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
               (const_string *)in_stack_ffffffffffffd320);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])pcVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar7);
    local_1d68 = CTxMemPool::size((CTxMemPool *)pcVar11);
    pcVar11 = "expected_pool_size";
    this_01 = (ValidationState<PackageValidationResult> *)&expected_pool_size;
    pcVar7 = "m_node.mempool->size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_1d50,local_1d60,0x393,1,2,&local_1d68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar7);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
    uVar13 = (undefined1)((ulong)in_stack_ffffffffffffd450 >> 0x38);
  } while (bVar3);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar7);
  ChainstateManager::ActiveChainstate((ChainstateManager *)pcVar11);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar11);
  std::optional<CFeeRate>::optional((optional<CFeeRate> *)pcVar7);
  ProcessNewPackage(in_stack_ffffffffffffd380,in_stack_ffffffffffffd378,
                    (Package *)CONCAT17(in_stack_ffffffffffffd377,in_stack_ffffffffffffd370),
                    (bool)in_stack_ffffffffffffd3f7,in_stack_ffffffffffffd368);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::get
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar7);
  CheckPackageMempoolAcceptResult_abi_cxx11_
            (in_stack_ffffffffffffd460,in_stack_ffffffffffffd458,(bool)uVar13,
             in_stack_ffffffffffffd448);
  bVar3 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)pcVar7);
  if (bVar3) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)this_01 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar11);
      boost::unit_test::operator<<
                ((lazy_ostream *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1da0,local_1dc0,&local_1dd0,0x397,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
  }
  else {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      local_1e28.m_result =
           ValidationState<PackageValidationResult>::GetResult
                     ((ValidationState<PackageValidationResult> *)pcVar7);
      local_1e28.m_mode = M_ERROR;
      pcVar11 = "PackageValidationResult::PCKG_TX";
      this_01 = &local_1e28;
      pcVar7 = "submit_rich_parent.m_state.GetResult()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
                (&local_1e28.m_reject_reason.field_2,&local_1e28.m_reject_reason,0x39a,1,2,
                 &local_1e28.m_result);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      ValidationState<PackageValidationResult>::GetRejectReason_abi_cxx11_(this_01);
      pcVar11 = "\"transaction failed\"";
      this_01 = (ValidationState<PackageValidationResult> *)0x1e69d78;
      pcVar7 = "submit_rich_parent.m_state.GetRejectReason()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[19]>
                (local_1e68,local_1e78,0x39b,1,2,local_658);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar7);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar7);
    CTransaction::GetWitnessHash((CTransaction *)pcVar7);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar7);
    std::
    map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            *)this_01,(key_type *)pcVar7);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar7);
    CTransaction::GetWitnessHash((CTransaction *)pcVar7);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar7);
    it_child_2 = std::
                 map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                 ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                         *)this_01,(key_type *)pcVar7);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)this_01 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)this_01,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1ec0,local_1ee0,local_1f00,0x39f,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)this_01 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)this_01,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1f38,local_1f58,local_1f78,0x3a0,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      ValidationState<TxValidationResult>::GetRejectReason_abi_cxx11_
                ((ValidationState<TxValidationResult> *)this_01);
      std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar11,
                      (char *)this_01);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)this_01 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)this_01,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1fb0,local_1fd0,local_1ff0,0x3a1,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      std::optional<long>::value((optional<long> *)pcVar11);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)this_01 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      std::optional<long>::value((optional<long> *)pcVar11);
      tinyformat::format<long,long>
                ((char *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 (long *)in_stack_ffffffffffffd330,(long *)in_stack_ffffffffffffd328);
      boost::unit_test::operator<<
                ((lazy_ostream *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(&local_2028,local_2048,&local_2058,0x3a3,CHECK)
      ;
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)pcVar7);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                )pcVar11);
      GetVirtualTransactionSize((CTransaction *)pcVar7);
      CFeeRate::CFeeRate((CFeeRate *)CONCAT44(in_stack_ffffffffffffd31c,in_stack_ffffffffffffd318),
                         (CAmount *)CONCAT44(in_stack_ffffffffffffd314,in_stack_ffffffffffffd310),
                         (uint32_t)((ulong)pcVar11 >> 0x20));
      std::operator==((optional<CFeeRate> *)pcVar11,(CFeeRate *)this_01);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)this_01 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)this_01,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2090,local_20b8,local_20d8,0x3a4,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::
               operator->((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *
                          )pcVar7);
      local_212c.m_mode = M_INVALID;
      pcVar11 = "MempoolAcceptResult::ResultType::INVALID";
      this_01 = &local_212c;
      pcVar7 = "it_child->second.m_result_type";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MempoolAcceptResult::ResultType,MempoolAcceptResult::ResultType>
                ((undefined1 *)((long)&local_212c.m_reject_reason._M_string_length + 4),
                 &local_212c.m_result,0x3a5,1,2,&ppVar5->second);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      local_2188.m_result =
           ValidationState<TxValidationResult>::GetResult
                     ((ValidationState<TxValidationResult> *)pcVar7);
      local_2188.m_mode = 10;
      pcVar11 = "TxValidationResult::TX_MEMPOOL_POLICY";
      this_01 = &local_2188;
      pcVar7 = "it_child->second.m_state.GetResult()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxValidationResult,TxValidationResult>
                (&local_2188.m_reject_reason.field_2,&local_2188.m_reject_reason,0x3a6,1,2,
                 &local_2188.m_result);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar7);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),
                 in_stack_ffffffffffffd330,(size_t)in_stack_ffffffffffffd328,
                 (const_string *)in_stack_ffffffffffffd320);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar7);
      ValidationState<TxValidationResult>::GetRejectReason_abi_cxx11_
                ((ValidationState<TxValidationResult> *)this_01);
      std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar11,
                      (char *)this_01);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar11,SUB81((ulong)this_01 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      boost::unit_test::operator<<((lazy_ostream *)this_01,(basic_cstring<const_char> *)pcVar7);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
      pcVar7 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_21c0,local_21e0,local_2200,0x3a7,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar7);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar7);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar7);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
      in_stack_ffffffffffffd33c = CONCAT13(bVar3,(int3)in_stack_ffffffffffffd33c);
    } while (bVar3);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar7);
  expected_pool_size = expected_pool_size + 1;
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar7);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffd33c,in_stack_ffffffffffffd338),file
               ,(size_t)in_stack_ffffffffffffd328,(const_string *)in_stack_ffffffffffffd320);
    in_stack_ffffffffffffd328 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])pcVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar11,(pointer)this_01,(unsigned_long)pcVar7);
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar7);
    in_stack_ffffffffffffd320 = (CKey *)CTxMemPool::size((CTxMemPool *)pcVar11);
    pcVar11 = "expected_pool_size";
    this_01 = (ValidationState<PackageValidationResult> *)&expected_pool_size;
    pcVar7 = "m_node.mempool->size()";
    local_2258 = in_stack_ffffffffffffd320;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_2240,local_2250,0x3aa,1,2,&local_2258);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar7);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult((PackageMempoolAcceptResult *)pcVar7);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar7);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar7);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar7);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar7);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)pcVar11);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar7);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar7);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar7);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar7);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)pcVar11);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar7);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar7);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar7);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar7);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)pcVar11);
  CScript::~CScript((CScript *)pcVar7);
  CKey::~CKey((CKey *)pcVar7);
  CScript::~CScript((CScript *)pcVar7);
  CKey::~CKey((CKey *)pcVar7);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)pcVar7);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(package_cpfp_tests)
{
    mineBlocks(5);
    MockMempoolMinFee(CFeeRate(5000));
    LOCK(::cs_main);
    size_t expected_pool_size = m_node.mempool->size();
    CKey child_key = GenerateRandomKey();
    CScript parent_spk = GetScriptForDestination(WitnessV0KeyHash(child_key.GetPubKey()));
    CKey grandchild_key = GenerateRandomKey();
    CScript child_spk = GetScriptForDestination(WitnessV0KeyHash(grandchild_key.GetPubKey()));

    // low-fee parent and high-fee child package
    const CAmount coinbase_value{50 * COIN};
    const CAmount parent_value{coinbase_value - low_fee_amt};
    const CAmount child_value{parent_value - COIN};

    Package package_cpfp;
    auto mtx_parent = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[0], /*input_vout=*/0,
                                                    /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                    /*output_destination=*/parent_spk,
                                                    /*output_amount=*/parent_value, /*submit=*/false);
    CTransactionRef tx_parent = MakeTransactionRef(mtx_parent);
    package_cpfp.push_back(tx_parent);

    auto mtx_child = CreateValidMempoolTransaction(/*input_transaction=*/tx_parent, /*input_vout=*/0,
                                                   /*input_height=*/101, /*input_signing_key=*/child_key,
                                                   /*output_destination=*/child_spk,
                                                   /*output_amount=*/child_value, /*submit=*/false);
    CTransactionRef tx_child = MakeTransactionRef(mtx_child);
    package_cpfp.push_back(tx_child);

    // Package feerate is calculated using modified fees, and prioritisetransaction accepts negative
    // fee deltas. This should be taken into account. De-prioritise the parent transaction
    // to bring the package feerate to 0.
    m_node.mempool->PrioritiseTransaction(tx_parent->GetHash(), child_value - coinbase_value);
    {
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
        const auto submit_cpfp_deprio = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                   package_cpfp, /*test_accept=*/ false, /*client_maxfeerate=*/{});
        if (auto err_cpfp_deprio{CheckPackageMempoolAcceptResult(package_cpfp, submit_cpfp_deprio, /*expect_valid=*/false, m_node.mempool.get())}) {
            BOOST_ERROR(err_cpfp_deprio.value());
        } else {
            BOOST_CHECK_EQUAL(submit_cpfp_deprio.m_state.GetResult(), PackageValidationResult::PCKG_TX);
            BOOST_CHECK_EQUAL(submit_cpfp_deprio.m_tx_results.find(tx_parent->GetWitnessHash())->second.m_state.GetResult(),
                              TxValidationResult::TX_MEMPOOL_POLICY);
            BOOST_CHECK_EQUAL(submit_cpfp_deprio.m_tx_results.find(tx_child->GetWitnessHash())->second.m_state.GetResult(),
                              TxValidationResult::TX_MISSING_INPUTS);
            BOOST_CHECK(submit_cpfp_deprio.m_tx_results.find(tx_parent->GetWitnessHash())->second.m_state.GetRejectReason() == "min relay fee not met");
            BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
        }
    }

    // Clear the prioritisation of the parent transaction.
    WITH_LOCK(m_node.mempool->cs, m_node.mempool->ClearPrioritisation(tx_parent->GetHash()));

    // Package CPFP: Even though the parent's feerate is below the mempool minimum feerate, the
    // child pays enough for the package feerate to meet the threshold.
    {
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
        const auto submit_cpfp = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                   package_cpfp, /*test_accept=*/ false, /*client_maxfeerate=*/{});
        if (auto err_cpfp{CheckPackageMempoolAcceptResult(package_cpfp, submit_cpfp, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_cpfp.value());
        } else {
            auto it_parent = submit_cpfp.m_tx_results.find(tx_parent->GetWitnessHash());
            auto it_child = submit_cpfp.m_tx_results.find(tx_child->GetWitnessHash());
            BOOST_CHECK(it_parent->second.m_result_type == MempoolAcceptResult::ResultType::VALID);
            BOOST_CHECK(it_parent->second.m_base_fees.value() == coinbase_value - parent_value);
            BOOST_CHECK(it_child->second.m_result_type == MempoolAcceptResult::ResultType::VALID);
            BOOST_CHECK(it_child->second.m_base_fees.value() == COIN);

            const CFeeRate expected_feerate(coinbase_value - child_value,
                                            GetVirtualTransactionSize(*tx_parent) + GetVirtualTransactionSize(*tx_child));
            BOOST_CHECK(it_parent->second.m_effective_feerate.value() == expected_feerate);
            BOOST_CHECK(it_child->second.m_effective_feerate.value() == expected_feerate);
            std::vector<Wtxid> expected_wtxids({tx_parent->GetWitnessHash(), tx_child->GetWitnessHash()});
            BOOST_CHECK(it_parent->second.m_wtxids_fee_calculations.value() == expected_wtxids);
            BOOST_CHECK(it_child->second.m_wtxids_fee_calculations.value() == expected_wtxids);
            BOOST_CHECK(expected_feerate.GetFeePerK() > 1000);
        }
        expected_pool_size += 2;
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }

    // Just because we allow low-fee parents doesn't mean we allow low-feerate packages.
    // The mempool minimum feerate is 5sat/vB, but this package just pays 800 satoshis total.
    // The child fees would be able to pay for itself, but isn't enough for the entire package.
    Package package_still_too_low;
    const CAmount parent_fee{200};
    const CAmount child_fee{600};
    auto mtx_parent_cheap = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[1], /*input_vout=*/0,
                                                          /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                          /*output_destination=*/parent_spk,
                                                          /*output_amount=*/coinbase_value - parent_fee, /*submit=*/false);
    CTransactionRef tx_parent_cheap = MakeTransactionRef(mtx_parent_cheap);
    package_still_too_low.push_back(tx_parent_cheap);
    BOOST_CHECK(m_node.mempool->GetMinFee().GetFee(GetVirtualTransactionSize(*tx_parent_cheap)) > parent_fee);
    BOOST_CHECK(m_node.mempool->m_opts.min_relay_feerate.GetFee(GetVirtualTransactionSize(*tx_parent_cheap)) <= parent_fee);

    auto mtx_child_cheap = CreateValidMempoolTransaction(/*input_transaction=*/tx_parent_cheap, /*input_vout=*/0,
                                                         /*input_height=*/101, /*input_signing_key=*/child_key,
                                                         /*output_destination=*/child_spk,
                                                         /*output_amount=*/coinbase_value - parent_fee - child_fee, /*submit=*/false);
    CTransactionRef tx_child_cheap = MakeTransactionRef(mtx_child_cheap);
    package_still_too_low.push_back(tx_child_cheap);
    BOOST_CHECK(m_node.mempool->GetMinFee().GetFee(GetVirtualTransactionSize(*tx_child_cheap)) <= child_fee);
    BOOST_CHECK(m_node.mempool->GetMinFee().GetFee(GetVirtualTransactionSize(*tx_parent_cheap) + GetVirtualTransactionSize(*tx_child_cheap)) > parent_fee + child_fee);
    BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);

    // Cheap package should fail for being too low fee.
    {
        const auto submit_package_too_low = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                   package_still_too_low, /*test_accept=*/false, /*client_maxfeerate=*/{});
        if (auto err_package_too_low{CheckPackageMempoolAcceptResult(package_still_too_low, submit_package_too_low, /*expect_valid=*/false, m_node.mempool.get())}) {
            BOOST_ERROR(err_package_too_low.value());
        } else {
            // Individual feerate of parent is too low.
            BOOST_CHECK_EQUAL(submit_package_too_low.m_tx_results.at(tx_parent_cheap->GetWitnessHash()).m_state.GetResult(),
                              TxValidationResult::TX_RECONSIDERABLE);
            BOOST_CHECK(submit_package_too_low.m_tx_results.at(tx_parent_cheap->GetWitnessHash()).m_effective_feerate.value() ==
                        CFeeRate(parent_fee, GetVirtualTransactionSize(*tx_parent_cheap)));
            // Package feerate of parent + child is too low.
            BOOST_CHECK_EQUAL(submit_package_too_low.m_tx_results.at(tx_child_cheap->GetWitnessHash()).m_state.GetResult(),
                              TxValidationResult::TX_RECONSIDERABLE);
            BOOST_CHECK(submit_package_too_low.m_tx_results.at(tx_child_cheap->GetWitnessHash()).m_effective_feerate.value() ==
                        CFeeRate(parent_fee + child_fee, GetVirtualTransactionSize(*tx_parent_cheap) + GetVirtualTransactionSize(*tx_child_cheap)));
        }
        BOOST_CHECK_EQUAL(submit_package_too_low.m_state.GetResult(), PackageValidationResult::PCKG_TX);
        BOOST_CHECK_EQUAL(submit_package_too_low.m_state.GetRejectReason(), "transaction failed");
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }

    // Package feerate includes the modified fees of the transactions.
    // This means a child with its fee delta from prioritisetransaction can pay for a parent.
    m_node.mempool->PrioritiseTransaction(tx_child_cheap->GetHash(), 1 * COIN);
    // Now that the child's fees have "increased" by 1 BTC, the cheap package should succeed.
    {
        const auto submit_prioritised_package = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                                  package_still_too_low, /*test_accept=*/false, /*client_maxfeerate=*/{});
        if (auto err_prioritised{CheckPackageMempoolAcceptResult(package_still_too_low, submit_prioritised_package, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_prioritised.value());
        } else {
            const CFeeRate expected_feerate(1 * COIN + parent_fee + child_fee,
                GetVirtualTransactionSize(*tx_parent_cheap) + GetVirtualTransactionSize(*tx_child_cheap));
            BOOST_CHECK_EQUAL(submit_prioritised_package.m_tx_results.size(), package_still_too_low.size());
            auto it_parent = submit_prioritised_package.m_tx_results.find(tx_parent_cheap->GetWitnessHash());
            auto it_child = submit_prioritised_package.m_tx_results.find(tx_child_cheap->GetWitnessHash());
            BOOST_CHECK(it_parent->second.m_result_type == MempoolAcceptResult::ResultType::VALID);
            BOOST_CHECK(it_parent->second.m_base_fees.value() == parent_fee);
            BOOST_CHECK(it_parent->second.m_effective_feerate.value() == expected_feerate);
            BOOST_CHECK(it_child->second.m_result_type == MempoolAcceptResult::ResultType::VALID);
            BOOST_CHECK(it_child->second.m_base_fees.value() == child_fee);
            BOOST_CHECK(it_child->second.m_effective_feerate.value() == expected_feerate);
            std::vector<Wtxid> expected_wtxids({tx_parent_cheap->GetWitnessHash(), tx_child_cheap->GetWitnessHash()});
            BOOST_CHECK(it_parent->second.m_wtxids_fee_calculations.value() == expected_wtxids);
            BOOST_CHECK(it_child->second.m_wtxids_fee_calculations.value() == expected_wtxids);
        }
        expected_pool_size += 2;
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }

    // Package feerate is calculated without topology in mind; it's just aggregating fees and sizes.
    // However, this should not allow parents to pay for children. Each transaction should be
    // validated individually first, eliminating sufficient-feerate parents before they are unfairly
    // included in the package feerate. It's also important that the low-fee child doesn't prevent
    // the parent from being accepted.
    Package package_rich_parent;
    const CAmount high_parent_fee{1 * COIN};
    auto mtx_parent_rich = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[2], /*input_vout=*/0,
                                                         /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                         /*output_destination=*/parent_spk,
                                                         /*output_amount=*/coinbase_value - high_parent_fee, /*submit=*/false);
    CTransactionRef tx_parent_rich = MakeTransactionRef(mtx_parent_rich);
    package_rich_parent.push_back(tx_parent_rich);

    auto mtx_child_poor = CreateValidMempoolTransaction(/*input_transaction=*/tx_parent_rich, /*input_vout=*/0,
                                                        /*input_height=*/101, /*input_signing_key=*/child_key,
                                                        /*output_destination=*/child_spk,
                                                        /*output_amount=*/coinbase_value - high_parent_fee, /*submit=*/false);
    CTransactionRef tx_child_poor = MakeTransactionRef(mtx_child_poor);
    package_rich_parent.push_back(tx_child_poor);

    // Parent pays 1 BTC and child pays none. The parent should be accepted without the child.
    {
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
        const auto submit_rich_parent = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                          package_rich_parent, /*test_accept=*/false, /*client_maxfeerate=*/{});
        if (auto err_rich_parent{CheckPackageMempoolAcceptResult(package_rich_parent, submit_rich_parent, /*expect_valid=*/false, m_node.mempool.get())}) {
            BOOST_ERROR(err_rich_parent.value());
        } else {
            // The child would have been validated on its own and failed.
            BOOST_CHECK_EQUAL(submit_rich_parent.m_state.GetResult(), PackageValidationResult::PCKG_TX);
            BOOST_CHECK_EQUAL(submit_rich_parent.m_state.GetRejectReason(), "transaction failed");

            auto it_parent = submit_rich_parent.m_tx_results.find(tx_parent_rich->GetWitnessHash());
            auto it_child = submit_rich_parent.m_tx_results.find(tx_child_poor->GetWitnessHash());
            BOOST_CHECK(it_parent->second.m_result_type == MempoolAcceptResult::ResultType::VALID);
            BOOST_CHECK(it_child->second.m_result_type == MempoolAcceptResult::ResultType::INVALID);
            BOOST_CHECK(it_parent->second.m_state.GetRejectReason() == "");
            BOOST_CHECK_MESSAGE(it_parent->second.m_base_fees.value() == high_parent_fee,
                    strprintf("rich parent: expected fee %s, got %s", high_parent_fee, it_parent->second.m_base_fees.value()));
            BOOST_CHECK(it_parent->second.m_effective_feerate == CFeeRate(high_parent_fee, GetVirtualTransactionSize(*tx_parent_rich)));
            BOOST_CHECK_EQUAL(it_child->second.m_result_type, MempoolAcceptResult::ResultType::INVALID);
            BOOST_CHECK_EQUAL(it_child->second.m_state.GetResult(), TxValidationResult::TX_MEMPOOL_POLICY);
            BOOST_CHECK(it_child->second.m_state.GetRejectReason() == "min relay fee not met");
        }
        expected_pool_size += 1;
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }
}